

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltc_constraints_calculator.cpp
# Opt level: O2

vector<float,_std::allocator<float>_> * __thiscall
ltc_constraints_calculator::calculate_constraints
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,
          ltc_constraints_calculator *this,vector<float,_std::allocator<float>_> *parameters)

{
  pointer pfVar1;
  pointer pfVar2;
  ostream *poVar3;
  logic_error *this_00;
  long lVar4;
  allocator_type local_19;
  
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,2,&local_19);
  pfVar1 = (parameters->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(parameters->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pfVar1 == 0xc) {
    pfVar2 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
      pfVar2[lVar4] = 1e-06 - pfVar1[lVar4];
    }
    return __return_storage_ptr__;
  }
  poVar3 = log_error();
  poVar3 = std::operator<<(poVar3,"Expected 3 parameters in ltc_constraints_calculator, received ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,".");
  std::endl<char,std::char_traits<char>>(poVar3);
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Expected 3 parameters.");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

std::vector<float> ltc_constraints_calculator::calculate_constraints(const std::vector<float> &parameters)
{
  auto constraints = std::vector<float>(2);
  // constraints g(x) <= 0

  if (parameters.size() != 3)
  {
    log_error() << "Expected 3 parameters in ltc_constraints_calculator, received " << parameters.size() << "."
      << std::endl;

    throw std::logic_error("Expected 3 parameters.");
  }

  float parameter_min_value = 1e-6f;

  for (auto i = 0; i < 2; ++i)
  {
    // x >= 1e-6   ==>   1e-6 - x <= 0
    constraints[i] = parameter_min_value - parameters[i];
  }

  return constraints;
}